

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

_Bool upb_Message_NextUnknown(upb_Message *msg,upb_StringView *data,uintptr_t *iter)

{
  upb_Message_Internal ptr;
  _Bool _Var1;
  upb_Message_Internal *puVar2;
  upb_StringView *puVar3;
  uintptr_t uVar4;
  upb_TaggedAuxPtr tagged_ptr;
  size_t i;
  upb_Message_Internal *in;
  uintptr_t *iter_local;
  upb_StringView *data_local;
  upb_Message *msg_local;
  
  puVar2 = _upb_Message_GetInternal_dont_copy_me__upb_internal_use_only(msg);
  tagged_ptr.ptr = *iter;
  if (puVar2 == (upb_Message_Internal *)0x0) {
LAB_004c98da:
    data->size = 0;
    data->data = (char *)0x0;
    *iter = tagged_ptr.ptr;
    msg_local._7_1_ = false;
  }
  else {
    do {
      if (puVar2->size <= tagged_ptr.ptr) goto LAB_004c98da;
      uVar4 = tagged_ptr.ptr + 1;
      ptr = puVar2[tagged_ptr.ptr + 1];
      _Var1 = upb_TaggedAuxPtr_IsUnknown((upb_TaggedAuxPtr)ptr);
      tagged_ptr.ptr = uVar4;
    } while (!_Var1);
    puVar3 = upb_TaggedAuxPtr_UnknownData((upb_TaggedAuxPtr)ptr);
    data->data = puVar3->data;
    data->size = puVar3->size;
    *iter = uVar4;
    msg_local._7_1_ = true;
  }
  return msg_local._7_1_;
}

Assistant:

UPB_INLINE bool upb_Message_NextUnknown(const struct upb_Message* msg,
                                        upb_StringView* data, uintptr_t* iter) {
  const upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  size_t i = *iter;
  if (in) {
    while (i < in->size) {
      upb_TaggedAuxPtr tagged_ptr = in->aux_data[i++];
      if (upb_TaggedAuxPtr_IsUnknown(tagged_ptr)) {
        *data = *upb_TaggedAuxPtr_UnknownData(tagged_ptr);
        *iter = i;
        return true;
      }
    }
  }
  data->size = 0;
  data->data = NULL;
  *iter = i;
  return false;
}